

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O0

void __thiscall QTuioHandler::process2DObjSet(QTuioHandler *this,QOscMessage *message)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QDebug *o;
  const_reference pQVar4;
  QTuioToken *this_00;
  QTuioToken *in_RDI;
  long in_FS_OFFSET;
  float vx_00;
  float vy_00;
  undefined4 uVar5;
  float acceleration_00;
  float angularVelocity_00;
  QTuioToken *tok;
  float angularAcceleration;
  float acceleration;
  float angularVelocity;
  float vy;
  float vx;
  float angle;
  float y;
  float x;
  int classId;
  Iterator it;
  int id;
  QList<QVariant> arguments;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QOscMessage *in_stack_fffffffffffffe88;
  float x_00;
  char *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffed8;
  QDebug local_108 [5];
  QDebug local_e0;
  iterator local_d8;
  iterator local_d0;
  undefined4 local_c4;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90 [5];
  QDebug local_68;
  QList<QVariant> local_60;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_60.d.ptr = (QVariant *)0xaaaaaaaaaaaaaaaa;
  local_60.d.size = -0x5555555555555556;
  QOscMessage::arguments(in_stack_fffffffffffffe88);
  qVar3 = QList<QVariant>::size(&local_60);
  if (qVar3 < 7) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcTuioSet();
    anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,
               (QLoggingCategory *)in_stack_fffffffffffffe88);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x11209c);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98,(int)((ulong)in_RDI >> 0x20),
                 &in_stack_fffffffffffffe88->m_isValid,(char *)0x1120b5);
      QMessageLogger::warning();
      in_stack_fffffffffffffe88 =
           (QOscMessage *)
           QDebug::operator<<((QDebug *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffed8);
      QList<QVariant>::size(&local_60);
      QDebug::operator<<((QDebug *)in_RDI,(qint64)in_stack_fffffffffffffe88);
      QDebug::~QDebug(&local_68);
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe88);
    iVar2 = QVariant::userType((QVariant *)0x11213c);
    if (iVar2 == 2) {
      QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe88);
      iVar2 = QVariant::userType((QVariant *)0x11215f);
      if (iVar2 == 2) {
        QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe88);
        iVar2 = QVariant::userType((QVariant *)0x112182);
        if (iVar2 == 0x26) {
          QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe88);
          iVar2 = QVariant::userType((QVariant *)0x1121a5);
          if (iVar2 == 0x26) {
            QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe88);
            iVar2 = QVariant::userType((QVariant *)0x1121c8);
            if (iVar2 == 0x26) {
              QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe88);
              iVar2 = QVariant::userType((QVariant *)0x1121eb);
              if (iVar2 == 0x26) {
                QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe88);
                iVar2 = QVariant::userType((QVariant *)0x11220e);
                if (iVar2 == 0x26) {
                  QList<QVariant>::at((QList<QVariant> *)in_RDI,(qsizetype)in_stack_fffffffffffffe88
                                     );
                  iVar2 = QVariant::userType((QVariant *)0x11222d);
                  if (iVar2 == 0x26) {
                    QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                        (qsizetype)in_stack_fffffffffffffe88);
                    iVar2 = QVariant::userType((QVariant *)0x11224c);
                    if (iVar2 == 0x26) {
                      QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                          (qsizetype)in_stack_fffffffffffffe88);
                      iVar2 = QVariant::userType((QVariant *)0x11226b);
                      if (iVar2 == 0x26) {
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        local_c4 = QVariant::toInt((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        iVar2 = QVariant::toInt((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        QVariant::toFloat((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        QVariant::toFloat((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        QVariant::toFloat((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        vx_00 = (float)QVariant::toFloat((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        vy_00 = (float)QVariant::toFloat((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        uVar5 = QVariant::toFloat((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        acceleration_00 = (float)QVariant::toFloat((bool *)pQVar4);
                        pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_RDI,
                                                     (qsizetype)in_stack_fffffffffffffe88);
                        angularVelocity_00 = (float)QVariant::toFloat((bool *)pQVar4);
                        local_d0._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
                        local_d0._M_node =
                             (_Base_ptr)
                             QMap<int,_QTuioToken>::find
                                       ((QMap<int,_QTuioToken> *)CONCAT44(vy_00,uVar5),
                                        (int *)CONCAT44(acceleration_00,angularVelocity_00));
                        local_d8._M_node =
                             (_Base_ptr)
                             QMap<int,_QTuioToken>::end
                                       ((QMap<int,_QTuioToken> *)
                                        CONCAT44(acceleration_00,angularVelocity_00));
                        bVar1 = operator==((iterator *)in_RDI,(iterator *)in_stack_fffffffffffffe88)
                        ;
                        if (bVar1) {
                          local_38 = 0xaaaaaaaaaaaaaaaa;
                          local_30 = 0xaaaaaaaaaaaaaaaa;
                          lcTuioSet();
                          anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                          QLoggingCategoryMacroHolder
                                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,
                                     (QLoggingCategory *)in_stack_fffffffffffffe88);
                          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                         operator_cast_to_bool
                                                   ((QLoggingCategoryMacroHolder *)&local_38), bVar1
                                ) {
                            anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                            name((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x112595);
                            QMessageLogger::QMessageLogger
                                      ((QMessageLogger *)
                                       CONCAT44(acceleration_00,angularVelocity_00),
                                       in_stack_fffffffffffffe98,(int)((ulong)in_RDI >> 0x20),
                                       &in_stack_fffffffffffffe88->m_isValid,(char *)0x1125ab);
                            QMessageLogger::warning();
                            QDebug::operator<<((QDebug *)CONCAT44(vy_00,uVar5),
                                               in_stack_fffffffffffffed8);
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::~QDebug(&local_e0);
                            local_30 = local_30 & 0xffffffffffffff00;
                          }
                        }
                        else {
                          local_48 = 0xaaaaaaaaaaaaaaaa;
                          local_40 = 0xaaaaaaaaaaaaaaaa;
                          lcTuioSet();
                          anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                          QLoggingCategoryMacroHolder
                                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
                                     (QLoggingCategory *)in_stack_fffffffffffffe88);
                          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                         operator_cast_to_bool
                                                   ((QLoggingCategoryMacroHolder *)&local_48), bVar1
                                ) {
                            anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)0>::
                            name((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x112657);
                            QMessageLogger::QMessageLogger
                                      ((QMessageLogger *)
                                       CONCAT44(acceleration_00,angularVelocity_00),
                                       in_stack_fffffffffffffe98,(int)((ulong)in_RDI >> 0x20),
                                       &in_stack_fffffffffffffe88->m_isValid,(char *)0x11266d);
                            QMessageLogger::debug();
                            QDebug::operator<<((QDebug *)CONCAT44(vy_00,uVar5),
                                               in_stack_fffffffffffffed8);
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)CONCAT44(vy_00,uVar5),
                                               in_stack_fffffffffffffed8);
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)CONCAT44(vy_00,uVar5),
                                               in_stack_fffffffffffffed8);
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)CONCAT44(vy_00,uVar5),
                                               in_stack_fffffffffffffed8);
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)CONCAT44(vy_00,uVar5),
                                               in_stack_fffffffffffffed8);
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::operator<<((QDebug *)in_RDI,
                                               (float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
                            QDebug::~QDebug(local_108);
                            local_40 = local_40 & 0xffffffffffffff00;
                          }
                          this_00 = QMap<int,_QTuioToken>::iterator::operator*((iterator *)0x112787)
                          ;
                          x_00 = (float)((ulong)in_stack_fffffffffffffe88 >> 0x20);
                          QTuioToken::setClassId(this_00,iVar2);
                          QTuioToken::setX(in_RDI,x_00);
                          QTuioToken::setY(in_RDI,x_00);
                          QTuioToken::setVX(this_00,vx_00);
                          QTuioToken::setVY(this_00,vy_00);
                          QTuioToken::setAcceleration(this_00,acceleration_00);
                          QTuioToken::setAngle(in_RDI,x_00);
                          QTuioToken::setAngularVelocity(this_00,angularVelocity_00);
                          QTuioToken::setAngularAcceleration(this_00,angularVelocity_00);
                        }
                        goto LAB_00112822;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    lcTuioSet();
    anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,
               (QLoggingCategory *)in_stack_fffffffffffffe88);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1122ca);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98,(int)((ulong)in_RDI >> 0x20),
                 &in_stack_fffffffffffffe88->m_isValid,(char *)0x1122e3);
      QMessageLogger::warning();
      o = QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                             ,in_stack_fffffffffffffed8);
      QDebug::QDebug(&local_98,o);
      operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (QList<QVariant> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      QDebug::~QDebug(local_90);
      QDebug::~QDebug(&local_98);
      QDebug::~QDebug(&local_a0);
      local_20 = local_20 & 0xffffffffffffff00;
    }
  }
LAB_00112822:
  QList<QVariant>::~QList((QList<QVariant> *)0x11282f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTuioHandler::process2DObjSet(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();
    if (arguments.size() < 7) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with too few arguments: " << arguments.size();
        return;
    }

    if (QMetaType::Type(arguments.at(1).userType()) != QMetaType::Int ||
            QMetaType::Type(arguments.at(2).userType()) != QMetaType::Int ||
            QMetaType::Type(arguments.at(3).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(4).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(5).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(6).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(7).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(8).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(9).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(10).userType()) != QMetaType::Float) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with bad types: " << arguments;
        return;
    }

    int id = arguments.at(1).toInt();
    int classId = arguments.at(2).toInt();
    float x = arguments.at(3).toFloat();
    float y = arguments.at(4).toFloat();
    float angle = arguments.at(5).toFloat();
    float vx = arguments.at(6).toFloat();
    float vy = arguments.at(7).toFloat();
    float angularVelocity = arguments.at(8).toFloat();
    float acceleration = arguments.at(9).toFloat();
    float angularAcceleration = arguments.at(10).toFloat();

    QMap<int, QTuioToken>::Iterator it = m_activeTokens.find(id);
    if (it == m_activeTokens.end()) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set for nonexistent token " << classId;
        return;
    }

    qCDebug(lcTuioSet) << "Processing SET for token " << classId << id << " @ " << x << y << " angle: " << angle <<
                          "vel" << vx << vy << angularVelocity << "acc" << acceleration << angularAcceleration;
    QTuioToken &tok = *it;
    tok.setClassId(classId);
    tok.setX(x);
    tok.setY(y);
    tok.setVX(vx);
    tok.setVY(vy);
    tok.setAcceleration(acceleration);
    tok.setAngle(angle);
    tok.setAngularVelocity(angularAcceleration);
    tok.setAngularAcceleration(angularAcceleration);
}